

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O0

size_t absl::lts_20250127::log_internal::anon_unknown_3::FormatLineNumber(int line,Span<char> *buf)

{
  size_type sVar1;
  pointer pcVar2;
  size_t bytes_formatted;
  char *p;
  size_t kLineFieldMaxLen;
  Span<char> *buf_local;
  Nonnull<char_*> pcStack_10;
  int line_local;
  
  sVar1 = Span<char>::size(buf);
  if (sVar1 < 0xe) {
    sVar1 = Span<char>::size(buf);
    Span<char>::remove_suffix(buf,sVar1);
    pcStack_10 = (Nonnull<char_*>)0x0;
  }
  else {
    pcVar2 = Span<char>::data(buf);
    *pcVar2 = ':';
    pcStack_10 = numbers_internal::FastIntToBuffer(line,pcVar2 + 1);
    *pcStack_10 = ']';
    pcStack_10[1] = ' ';
    pcVar2 = Span<char>::data(buf);
    pcStack_10 = pcStack_10 + (2 - (long)pcVar2);
    Span<char>::remove_prefix(buf,(size_type)pcStack_10);
  }
  return (size_t)pcStack_10;
}

Assistant:

size_t FormatLineNumber(int line, absl::Span<char>& buf) {
  constexpr size_t kLineFieldMaxLen =
      sizeof(":] ") + (1 + std::numeric_limits<int>::digits10 + 1) - sizeof("");
  if (ABSL_PREDICT_FALSE(buf.size() < kLineFieldMaxLen)) {
    // As above, we don't bother trying to truncate this if the buffer is too
    // short and it should never happen.
    buf.remove_suffix(buf.size());
    return 0;
  }
  char* p = buf.data();
  *p++ = ':';
  p = absl::numbers_internal::FastIntToBuffer(line, p);
  *p++ = ']';
  *p++ = ' ';
  const size_t bytes_formatted = static_cast<size_t>(p - buf.data());
  buf.remove_prefix(bytes_formatted);
  return bytes_formatted;
}